

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall chatra::Thread::finish(Thread *this)

{
  int iVar1;
  pointer pFVar2;
  Node *node;
  ReferenceGroup *pRVar3;
  element_type *peVar4;
  Class *pCVar5;
  Reference RVar6;
  __uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_> *__u;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__filename;
  SpinLock *this_00;
  _Alloc_hider local_78;
  unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> self;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Frame *local_40;
  allocator local_31;
  
  while( true ) {
    pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_40 = pFVar2 + -1;
    Frame::popAll(local_40);
    if (pFVar2[-1].exception != (TemporaryObject *)0x0) {
      node = pFVar2[-1].exceptionNode;
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff88,"unhandled exception",&local_31);
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      errorAtNode(&this->super_IErrorReceiver,Error,node,(string *)&stack0xffffffffffffff88,
                  &local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
      pCVar5 = getReferClass(((pFVar2[-1].exception)->targetRef).node);
      emitError(this,pCVar5->name,pFVar2[-1].exceptionNode,pFVar2[-1].stackTrace._M_dataplus._M_p);
      Frame::recycle(local_40,pFVar2[-1].exception);
      pFVar2[-1].exception = (TemporaryObject *)0x0;
    }
    if (pFVar2[-1].caughtException != (TemporaryObject *)0x0) {
      Frame::recycle(local_40,pFVar2[-1].caughtException);
      pFVar2[-1].caughtException = (TemporaryObject *)0x0;
    }
    if ((ulong)(((long)(this->frames).
                       super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->frames).
                      super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x110) < 3) break;
    popForFinish(this);
  }
  RVar6 = Scope::ref((this->runtime->scope)._M_t.
                     super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
                     super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
                     super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl,Parser);
  if (((RVar6.node)->group->super_Lockable).lockRequester._M_i ==
      (this->super_IdType<chatra::Requester,_chatra::Thread>).id) {
    pRVar3 = (RVar6.node)->group;
    iVar1 = (pRVar3->super_Lockable).lockCount;
    (pRVar3->super_Lockable).lockCount = iVar1 + -1;
    if (iVar1 < 2) {
      LOCK();
      (pRVar3->super_Lockable).lockRequester._M_i = 0xffffffffffffffff;
      UNLOCK();
    }
  }
  if (this->isInteractive == true) {
    checkTransferReq(this);
    LOCK();
    (this->readyToNextInteraction)._M_base._M_i = true;
    UNLOCK();
    peVar4 = (this->runtime->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar4->_vptr_IHost[5])
              (peVar4,(this->instance->super_IdType<chatra::InstanceId,_chatra::Instance>).id);
  }
  else {
    Frame::popAll((this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1);
    local_78._M_p = (pointer)0x0;
    this_00 = &this->instance->lockThreads;
    SpinLock::lock(this_00);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_IdType<chatra::Requester,_chatra::Thread>).id;
    __u = (__uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_> *)
          std::__detail::
          _Map_base<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&this->instance->threads,(key_type *)&local_58);
    std::__uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>::operator=
              ((__uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_> *)
               &stack0xffffffffffffff88,__u);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_IdType<chatra::Requester,_chatra::Thread>).id;
    __filename = &local_58;
    std::
    _Hashtable<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->instance->threads)._M_h);
    (this_00->flag).super___atomic_flag_base._M_i = false;
    IdType<chatra::Requester,_chatra::Thread>::remove
              (&this->super_IdType<chatra::Requester,_chatra::Thread>,(char *)__filename);
    checkTransferReq(this);
    std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::~unique_ptr
              ((unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> *)
               &stack0xffffffffffffff88);
  }
  return;
}

Assistant:

void Thread::finish() {
	for (;;) {
		auto& f = frames.back();
		f.popAll();

		if (f.exception != nullptr) {
			errorAtNode(*this, ErrorLevel::Error, f.exceptionNode, "unhandled exception", {});
			emitError(getReferClass(f.exception->getRef())->getName(), f.exceptionNode, f.stackTrace.data());

			f.recycle(f.exception);
			f.exception = nullptr;
		}

		if (f.caughtException != nullptr) {
			f.recycle(f.caughtException);
			f.caughtException = nullptr;
		}

		if (frames.size() <= residentialFrameCount)
			break;

		popForFinish();
	}

	auto parser = runtime.scope->ref(StringId::Parser);
	if (parser.lockedBy() == getId())
		parser.unlock();

	if (isInteractive) {
		checkTransferReq();
		readyToNextInteraction = true;
		runtime.host->onInteractiveInstanceReady(instance.getId());
		return;
	}

	// Remove returned value and exceptions
	frames.back().popAll();

	std::unique_ptr<Thread> self;
	{
		std::lock_guard<SpinLock> lock(instance.lockThreads);
		self = std::move(instance.threads[getId()]);
		instance.threads.erase(getId());
	}
	remove();
	checkTransferReq();
	chatra_assert(transferReq.empty());
}